

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VCloneEmpty(N_Vector W,int myid)

{
  int iVar1;
  N_Vector X;
  long lVar2;
  long lVar3;
  double dVar4;
  timespec spec;
  timespec local_38;
  
  clock_gettime(4,&local_38);
  lVar2 = local_38.tv_sec - base_time_tv_sec;
  dVar4 = (double)local_38.tv_nsec;
  X = N_VCloneEmpty(W);
  clock_gettime(4,&local_38);
  if (X == (N_Vector)0x0) {
    printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n",myid);
    puts("    After N_VCloneEmpty, X == NULL \n");
  }
  else {
    lVar3 = local_38.tv_sec - base_time_tv_sec;
    iVar1 = has_data(X);
    if (iVar1 == 0) {
      N_VDestroy(X);
      if (myid == 0) {
        puts("PASSED test -- N_VCloneEmpty ");
      }
      max_time(W,((double)local_38.tv_nsec / 1000000000.0 + (double)lVar3) -
                 (dVar4 / 1000000000.0 + (double)lVar2));
      if (print_time == 0) {
        return 0;
      }
      printf("%s Time: %22.15e\n\n","N_VCloneEmpty");
      return 0;
    }
    printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n",myid);
    puts("    Vector data != NULL \n");
    N_VDestroy(X);
  }
  return 1;
}

Assistant:

int Test_N_VCloneEmpty(N_Vector W, int myid)
{
  double   start_time, stop_time, maxt;
  N_Vector X;

  /* clone empty vector */
  start_time = get_time();
  X = N_VCloneEmpty(W);
  stop_time = get_time();

  /* check vector */
  if (X == NULL) {
    printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n", myid);
    printf("    After N_VCloneEmpty, X == NULL \n\n");
    return(1);
  }

  /* check vector data */
  if (has_data(X)) {
    printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n", myid);
    printf("    Vector data != NULL \n\n");
    N_VDestroy(X);
    return(1);
  }

  N_VDestroy(X);

  if (myid == 0)
    printf("PASSED test -- N_VCloneEmpty \n");
  
  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VCloneEmpty", maxt);

  return(0);
}